

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O1

void ThrustThingHelper(AActor *it,DAngle *angle,double force,INTBOOL nolimit)

{
  double dVar1;
  double dVar2;
  double dVar3;
  DAngle local_18;
  
  local_18 = (DAngle)angle->Degrees;
  AActor::Thrust(it,&local_18,force);
  if (nolimit == 0) {
    dVar2 = (it->Vel).X;
    dVar1 = (it->Vel).Y;
    dVar3 = 30.0;
    if (dVar2 <= 30.0) {
      dVar3 = dVar2;
    }
    (it->Vel).X = (double)(~-(ulong)(-30.0 < dVar2) & 0xc03e000000000000 |
                          (ulong)dVar3 & -(ulong)(-30.0 < dVar2));
    dVar2 = 30.0;
    if (dVar1 <= 30.0) {
      dVar2 = dVar1;
    }
    (it->Vel).Y = (double)(~-(ulong)(-30.0 < dVar1) & 0xc03e000000000000 |
                          (ulong)dVar2 & -(ulong)(-30.0 < dVar1));
  }
  return;
}

Assistant:

static void ThrustThingHelper(AActor *it, DAngle angle, double force, INTBOOL nolimit)
{
	it->Thrust(angle, force);
	if (!nolimit)
	{
		it->Vel.X = clamp(it->Vel.X, -MAXMOVE, MAXMOVE);
		it->Vel.Y = clamp(it->Vel.Y, -MAXMOVE, MAXMOVE);
	}
}